

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::SourceCodeInfo_Location::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  SourceCodeInfo_Location *pSVar2;
  MessageLite *value;
  string *value_00;
  SourceCodeInfo_Location **v1;
  SourceCodeInfo_Location **v2;
  char *failure_msg;
  LogMessage *pLVar3;
  RepeatedField<int> *pRVar4;
  RepeatedField<int> *pRVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *other;
  uint32_t *puVar6;
  Arena *pAVar7;
  uint32_t cached_has_bits;
  LogMessage local_80;
  Voidify local_69;
  SourceCodeInfo_Location *local_68;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  SourceCodeInfo_Location *from;
  SourceCodeInfo_Location *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  SourceCodeInfo_Location *local_30;
  anon_union_96_1_493b367e_for_SourceCodeInfo_Location_3 *local_28;
  string *local_20;
  SourceCodeInfo_Location *local_18;
  anon_union_96_1_493b367e_for_SourceCodeInfo_Location_3 *local_10;
  
  local_68 = (SourceCodeInfo_Location *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (SourceCodeInfo_Location *)to_msg;
  _this = (SourceCodeInfo_Location *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::SourceCodeInfo_Location_const*>(&local_68);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::SourceCodeInfo_Location*>(&from);
  local_60 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::SourceCodeInfo_Location_const*,google::protobuf::SourceCodeInfo_Location*>
                       (v1,v2,"&from != _this");
  if (local_60 == (Nullable<const_char_*>)0x0) {
    pRVar4 = _internal_mutable_path(from);
    pRVar5 = _internal_path((SourceCodeInfo_Location *)absl_log_internal_check_op_result);
    RepeatedField<int>::MergeFrom(pRVar4,pRVar5);
    pRVar4 = _internal_mutable_span(from);
    pRVar5 = _internal_span((SourceCodeInfo_Location *)absl_log_internal_check_op_result);
    RepeatedField<int>::MergeFrom(pRVar4,pRVar5);
    this = _internal_mutable_leading_detached_comments_abi_cxx11_(from);
    other = _internal_leading_detached_comments_abi_cxx11_
                      ((SourceCodeInfo_Location *)absl_log_internal_check_op_result);
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::MergeFrom(this,other);
    puVar6 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    pSVar2 = from;
    uVar1 = *puVar6;
    if ((uVar1 & 3) != 0) {
      if ((uVar1 & 1) != 0) {
        to_msg_local = (MessageLite *)
                       _internal_leading_comments_abi_cxx11_
                                 ((SourceCodeInfo_Location *)absl_log_internal_check_op_result);
        local_30 = pSVar2;
        local_28 = &pSVar2->field_0;
        puVar6 = internal::HasBits<1>::operator[](&(pSVar2->field_0)._impl_._has_bits_,0);
        value = to_msg_local;
        *puVar6 = *puVar6 | 1;
        pAVar7 = MessageLite::GetArena((MessageLite *)pSVar2);
        internal::ArenaStringPtr::Set<>
                  (&(pSVar2->field_0)._impl_.leading_comments_,(string *)value,pAVar7);
      }
      pSVar2 = from;
      if ((uVar1 & 2) != 0) {
        local_20 = _internal_trailing_comments_abi_cxx11_
                             ((SourceCodeInfo_Location *)absl_log_internal_check_op_result);
        local_18 = pSVar2;
        local_10 = &pSVar2->field_0;
        puVar6 = internal::HasBits<1>::operator[](&(pSVar2->field_0)._impl_._has_bits_,0);
        value_00 = local_20;
        *puVar6 = *puVar6 | 2;
        pAVar7 = MessageLite::GetArena((MessageLite *)pSVar2);
        internal::ArenaStringPtr::Set<>
                  (&(pSVar2->field_0)._impl_.trailing_comments_,value_00,pAVar7);
      }
    }
    puVar6 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
    *puVar6 = uVar1 | *puVar6;
    internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_60);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x39b7,failure_msg);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_80);
}

Assistant:

void SourceCodeInfo_Location::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<SourceCodeInfo_Location*>(&to_msg);
  auto& from = static_cast<const SourceCodeInfo_Location&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.SourceCodeInfo.Location)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_path()->MergeFrom(from._internal_path());
  _this->_internal_mutable_span()->MergeFrom(from._internal_span());
  _this->_internal_mutable_leading_detached_comments()->MergeFrom(from._internal_leading_detached_comments());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_leading_comments(from._internal_leading_comments());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_trailing_comments(from._internal_trailing_comments());
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}